

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_persistence_representations.h
# Opt level: O0

bool Gudhi::Persistence_representations::compare_points_sorting
               (pair<double,_double> f,pair<double,_double> s)

{
  pair<double,_double> s_local;
  pair<double,_double> f_local;
  
  if (s.first <= f.first) {
    if (f.first <= s.first) {
      if (f.second <= s.second) {
        f_local.second._7_1_ = false;
      }
      else {
        f_local.second._7_1_ = true;
      }
    }
    else {
      f_local.second._7_1_ = false;
    }
  }
  else {
    f_local.second._7_1_ = true;
  }
  return f_local.second._7_1_;
}

Assistant:

bool compare_points_sorting(std::pair<double, double> f, std::pair<double, double> s) {
  if (f.first < s.first) {
    return true;
  } else {  // f.first >= s.first
    if (f.first > s.first) {
      return false;
    } else {  // f.first == s.first
      if (f.second > s.second) {
        return true;
      } else {
        return false;
      }
    }
  }
}